

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZGeoEl_*,_4>::Resize(TPZManVector<TPZGeoEl_*,_4> *this,int64_t newsize)

{
  TPZGeoEl **ppTVar1;
  long lVar2;
  ostream *poVar3;
  TPZGeoEl **ppTVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  if (-1 < newsize) {
    lVar5 = (this->super_TPZVec<TPZGeoEl_*>).fNElements;
    if (lVar5 != newsize) {
      lVar2 = (this->super_TPZVec<TPZGeoEl_*>).fNAlloc;
      if (lVar2 < newsize) {
        if ((ulong)newsize < 5) {
          ppTVar4 = (this->super_TPZVec<TPZGeoEl_*>).fStore;
          ppTVar1 = this->fExtAlloc;
          if (ppTVar4 != ppTVar1) {
            lVar2 = 0;
            if (lVar5 < 1) {
              lVar5 = lVar2;
            }
            for (; lVar5 != lVar2; lVar2 = lVar2 + 1) {
              ppTVar1[lVar2] = ppTVar4[lVar2];
            }
            if (ppTVar4 != (TPZGeoEl **)0x0) {
              operator_delete__(ppTVar4);
            }
            (this->super_TPZVec<TPZGeoEl_*>).fStore = ppTVar1;
          }
          (this->super_TPZVec<TPZGeoEl_*>).fNElements = newsize;
          (this->super_TPZVec<TPZGeoEl_*>).fNAlloc = 0;
        }
        else {
          dVar7 = (double)lVar2 * 1.2;
          uVar6 = (long)dVar7;
          if (dVar7 < (double)newsize) {
            uVar6 = newsize;
          }
          lVar2 = 0;
          ppTVar4 = (TPZGeoEl **)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
          ppTVar1 = (this->super_TPZVec<TPZGeoEl_*>).fStore;
          if (lVar5 < 1) {
            lVar5 = lVar2;
          }
          for (; lVar5 != lVar2; lVar2 = lVar2 + 1) {
            ppTVar4[lVar2] = ppTVar1[lVar2];
          }
          if (ppTVar1 != (TPZGeoEl **)0x0 && ppTVar1 != this->fExtAlloc) {
            operator_delete__(ppTVar1);
          }
          (this->super_TPZVec<TPZGeoEl_*>).fStore = ppTVar4;
          (this->super_TPZVec<TPZGeoEl_*>).fNElements = newsize;
          (this->super_TPZVec<TPZGeoEl_*>).fNAlloc = uVar6;
        }
      }
      else {
        (this->super_TPZVec<TPZGeoEl_*>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}